

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O1

xcb_generic_iterator_t
xcb_input_device_resolution_state_end(xcb_input_device_resolution_state_iterator_t i)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  xcb_input_device_resolution_state_t *pxVar5;
  xcb_generic_iterator_t xVar6;
  
  uVar4 = i._8_8_;
  pxVar5 = i.data;
  if (i.rem < 1) {
    uVar2 = uVar4 >> 0x20;
  }
  else {
    iVar3 = i.rem + 1;
    uVar4 = 0;
    do {
      uVar1 = pxVar5->num_valuators * 0xc + 8;
      uVar2 = (ulong)uVar1;
      pxVar5 = (xcb_input_device_resolution_state_t *)((long)&pxVar5->control_id + (long)(int)uVar1)
      ;
      iVar3 = iVar3 + -1;
    } while (1 < iVar3);
  }
  xVar6._8_8_ = uVar4 & 0xffffffff | uVar2 << 0x20;
  xVar6.data = pxVar5;
  return xVar6;
}

Assistant:

xcb_generic_iterator_t
xcb_input_device_resolution_state_end (xcb_input_device_resolution_state_iterator_t i)
{
    xcb_generic_iterator_t ret;
    while(i.rem > 0)
        xcb_input_device_resolution_state_next(&i);
    ret.data = i.data;
    ret.rem = i.rem;
    ret.index = i.index;
    return ret;
}